

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O2

void __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>,_const_int,_const_std::pair<int,_int>_>
::operator++(Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>,_const_int,_const_std::pair<int,_int>_>
             *this,int param_1)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  
  lVar4 = (long)this->cur_bitmap_idx_;
  uVar5 = this->cur_bitmap_data_;
  iVar3 = this->cur_bitmap_idx_ << 6;
  while( true ) {
    lVar4 = lVar4 + 1;
    if (uVar5 != 0) {
      iVar1 = 0;
      for (uVar2 = uVar5; (uVar2 & 1) == 0; uVar2 = uVar2 >> 1 | 0x8000000000000000) {
        iVar1 = iVar1 + 1;
      }
      this->cur_idx_ = iVar1 + iVar3;
      this->cur_bitmap_data_ = uVar5 - 1 & uVar5;
      return;
    }
    this->cur_bitmap_idx_ = (int)lVar4;
    if (this->node_->bitmap_size_ <= lVar4) break;
    iVar3 = iVar3 + 0x40;
    uVar5 = this->node_->bitmap_[lVar4];
    this->cur_bitmap_data_ = uVar5;
  }
  this->cur_idx_ = -1;
  return;
}

Assistant:

void operator++(int) {
      while (cur_bitmap_data_ == 0) {
        cur_bitmap_idx_++;
        if (cur_bitmap_idx_ >= node_->bitmap_size_) {
          cur_idx_ = -1;
          return;
        }
        cur_bitmap_data_ = node_->bitmap_[cur_bitmap_idx_];
      }
      uint64_t bit = extract_rightmost_one(cur_bitmap_data_);
      cur_idx_ = get_offset(cur_bitmap_idx_, bit);
      cur_bitmap_data_ = remove_rightmost_one(cur_bitmap_data_);
    }